

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::FileGenerator::CreateHeaderInclude
          (string *__return_storage_ptr__,FileGenerator *this,string *basename,FileDescriptor *file)

{
  bool bVar1;
  string left;
  string right;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)basename);
  if ((this->options_).opensource_runtime == true) {
    bVar1 = IsWellKnownMessage(file);
    if (bVar1) {
      if ((this->options_).runtime_include_base._M_string_length == 0) {
        bVar1 = true;
        goto LAB_002ccfaa;
      }
      std::operator+(&bStack_a8,&(this->options_).runtime_include_base,basename);
      std::__cxx11::string::operator=((string *)&local_48,(string *)&bStack_a8);
      std::__cxx11::string::~string((string *)&bStack_a8);
    }
  }
  bVar1 = false;
LAB_002ccfaa:
  std::__cxx11::string::string((string *)&bStack_a8,"\"",(allocator *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"\"",(allocator *)&local_68);
  if (bVar1) {
    std::__cxx11::string::assign((char *)&bStack_a8);
    std::__cxx11::string::assign((char *)&local_88);
  }
  std::operator+(&local_68,&bStack_a8,&local_48);
  std::operator+(__return_storage_ptr__,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string FileGenerator::CreateHeaderInclude(const std::string& basename,
                                               const FileDescriptor* file) {
  bool use_system_include = false;
  std::string name = basename;

  if (options_.opensource_runtime) {
    if (IsWellKnownMessage(file)) {
      if (options_.runtime_include_base.empty()) {
        use_system_include = true;
      } else {
        name = options_.runtime_include_base + basename;
      }
    }
  }

  std::string left = "\"";
  std::string right = "\"";
  if (use_system_include) {
    left = "<";
    right = ">";
  }
  return left + name + right;
}